

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_return_by_value_constraint(intptr_t value_to_return,size_t size)

{
  Constraint *pCVar1;
  size_t in_RSI;
  void *in_RDI;
  Constraint *constraint;
  intptr_t actual_return;
  CgreenValue local_38;
  Constraint *local_20;
  void *local_18;
  size_t local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = malloc(in_RSI);
  memcpy(local_18,local_8,local_10);
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = test_true;
  pCVar1->name = "return by value";
  local_20 = pCVar1;
  make_cgreen_by_value(&local_38,local_18,local_10);
  (pCVar1->expected_value).type = local_38.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_38._4_4_;
  (pCVar1->expected_value).value = local_38.value;
  (pCVar1->expected_value).value_size = local_38.value_size;
  local_20->destroy = destroy_by_value_constraint;
  return local_20;
}

Assistant:

Constraint *create_return_by_value_constraint(intptr_t value_to_return, size_t size) {
    intptr_t actual_return = (intptr_t) malloc(size);
    memcpy((void*)actual_return, (void*)value_to_return, size);
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &test_true;
    constraint->name = "return by value";
    constraint->expected_value = make_cgreen_by_value((void*)actual_return, size);
    constraint->destroy = &destroy_by_value_constraint;

    return constraint;
}